

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O2

int lj_cf_print(lua_State *L)

{
  TValue *pTVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  cTValue *pcVar4;
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar5;
  char *__ptr;
  long lVar6;
  long lVar7;
  bool bVar8;
  MSize len;
  size_t size;
  
  pTVar1 = L->base;
  pTVar2 = L->top;
  pcVar4 = lj_tab_getstr((GCtab *)(L->env).gcptr64,
                         (GCstr *)(*(ulong *)((pTVar1[-2].u64 & 0x7fffffffffff) + 0x30) &
                                  0x7fffffffffff));
  if ((pcVar4 == (cTValue *)0x0) || (pcVar4->u64 == 0xffffffffffffffff)) {
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    pTVar3->u64 = *(ulong *)((L->base[-2].u64 & 0x7fffffffffff) + 0x30) & 0x7fffffffffff |
                  0xfffd800000000000;
    lua_gettable(L,-0x2712);
    aVar5 = L->top[-1].field_4;
  }
  else {
    pTVar3 = L->top;
    L->top = pTVar3 + 1;
    aVar5 = pcVar4->field_4;
    pTVar3->u64 = (uint64_t)aVar5;
  }
  lVar7 = (long)pTVar2 - (long)pTVar1 >> 3;
  if ((aVar5.it >> 0xf == 0x1fff7) && (*(char *)(((ulong)aVar5 & 0x7fffffffffff) + 10) == '\x12')) {
    bVar8 = *(long *)((L->glref).ptr64 + 0x2c0) == 0;
  }
  else {
    bVar8 = false;
  }
  lVar6 = 0;
  if (lVar7 < 1) {
    lVar7 = lVar6;
  }
  do {
    if (lVar7 * 8 == lVar6) {
      putchar(10);
      return 0;
    }
    pcVar4 = (cTValue *)((long)L->base + lVar6);
    if (bVar8) {
      __ptr = lj_strfmt_wstrnum(L,pcVar4,&len);
      if (__ptr == (char *)0x0) goto LAB_001504e6;
      size = (size_t)len;
    }
    else {
LAB_001504e6:
      L->top[1] = *pcVar4;
      *L->top = L->top[-1];
      L->top = L->top + 2;
      lua_call(L,1,1);
      __ptr = lua_tolstring(L,-1,&size);
      if (__ptr == (char *)0x0) {
        lj_err_caller(L,LJ_ERR_PRTOSTR);
      }
      L->top = L->top + -1;
    }
    if (lVar6 != 0) {
      putchar(9);
    }
    fwrite(__ptr,1,size,_stdout);
    lVar6 = lVar6 + 8;
  } while( true );
}

Assistant:

LJLIB_CF(print)
{
  ptrdiff_t i, nargs = L->top - L->base;
  cTValue *tv = lj_tab_getstr(tabref(L->env), strV(lj_lib_upvalue(L, 1)));
  int shortcut;
  if (tv && !tvisnil(tv)) {
    copyTV(L, L->top++, tv);
  } else {
    setstrV(L, L->top++, strV(lj_lib_upvalue(L, 1)));
    lua_gettable(L, LUA_GLOBALSINDEX);
    tv = L->top-1;
  }
  shortcut = (tvisfunc(tv) && funcV(tv)->c.ffid == FF_tostring) &&
	     !gcrefu(basemt_it(G(L), LJ_TNUMX));
  for (i = 0; i < nargs; i++) {
    cTValue *o = &L->base[i];
    const char *str;
    size_t size;
    MSize len;
    if (shortcut && (str = lj_strfmt_wstrnum(L, o, &len)) != NULL) {
      size = len;
    } else {
      copyTV(L, L->top+1, o);
      copyTV(L, L->top, L->top-1);
      L->top += 2;
      lua_call(L, 1, 1);
      str = lua_tolstring(L, -1, &size);
      if (!str)
	lj_err_caller(L, LJ_ERR_PRTOSTR);
      L->top--;
    }
    if (i)
      putchar('\t');
    fwrite(str, 1, size, stdout);
  }
  putchar('\n');
  return 0;
}